

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-dump.cpp
# Opt level: O2

string * getInstName_abi_cxx11_(string *__return_storage_ptr__,Value *val)

{
  uint uVar1;
  raw_ostream *prVar2;
  iterator iVar3;
  char *pcVar4;
  raw_os_ostream ro;
  ostringstream ostr;
  code *local_1e0;
  undefined4 local_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined8 local_1b0;
  undefined4 local_1a8;
  ostringstream *local_1a0;
  Value *local_198;
  ostringstream local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_1d8 = 0;
  local_1b8 = 0;
  local_1b0 = 0;
  local_1a8 = 1;
  local_1c0 = 0;
  local_1d0 = 0;
  uStack_1c8 = 0;
  local_1e0 = std::__throw_length_error;
  local_1a0 = local_190;
  if (dump_c_lines[0x80] == '\x01') {
    if (val != (Value *)0x0 && 0x1a < (byte)val[0x10]) {
      if (*(long *)(val + 0x30) == 0) {
        local_198 = val;
        iVar3 = std::
                _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_CVariableDecl>,_std::_Select1st<std::pair<const_llvm::Value_*const,_CVariableDecl>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_CVariableDecl>_>_>
                ::find(&valuesToVars._M_t,&local_198);
        if ((_Rb_tree_header *)iVar3._M_node == &valuesToVars._M_t._M_impl.super__Rb_tree_header) {
          pcVar4 = "(no dbg) ";
          goto LAB_00118923;
        }
        prVar2 = (raw_ostream *)
                 llvm::raw_ostream::operator<<
                           ((raw_ostream *)&local_1e0,(ulong)*(uint *)&iVar3._M_node[2]._M_parent);
        prVar2 = llvm::raw_ostream::operator<<(prVar2,":");
        uVar1 = *(uint *)((long)&iVar3._M_node[2]._M_parent + 4);
      }
      else {
        uVar1 = llvm::DebugLoc::getLine();
        prVar2 = (raw_ostream *)
                 llvm::raw_ostream::operator<<((raw_ostream *)&local_1e0,(ulong)uVar1);
        prVar2 = llvm::raw_ostream::operator<<(prVar2,":");
        uVar1 = llvm::DebugLoc::getCol();
      }
      llvm::raw_ostream::operator<<(prVar2,(ulong)uVar1);
      goto LAB_001189ee;
    }
    pcVar4 = "(no inst) ";
LAB_00118923:
    llvm::raw_ostream::operator<<((raw_ostream *)&local_1e0,pcVar4);
  }
  else if (val[0x10] == (Value)0x0) {
    pcVar4 = (char *)llvm::Value::getName();
    llvm::raw_ostream::operator<<((raw_ostream *)&local_1e0,pcVar4);
    goto LAB_001189ee;
  }
  llvm::operator<<((raw_ostream *)&local_1e0,val);
LAB_001189ee:
  llvm::raw_ostream::flush((raw_ostream *)&local_1e0);
  std::__cxx11::stringbuf::str();
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

static std::string getInstName(const llvm::Value *val) {
    assert(val);
    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (dump_c_lines) {
        if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
            const auto &DL = I->getDebugLoc();
            if (DL) {
                ro << DL.getLine() << ":" << DL.getCol();
            } else {
                auto Vit = valuesToVars.find(I);
                if (Vit != valuesToVars.end()) {
                    auto &decl = Vit->second;
                    ro << decl.line << ":" << decl.col;
                } else {
                    ro << "(no dbg) ";
                    ro << *val;
                }
            }
        } else {
            ro << "(no inst) ";
            ro << *val;
        }
        ro.flush();
        return ostr.str();
    }

    if (llvm::isa<llvm::Function>(val))
        ro << val->getName().data();
    else
        ro << *val;

    ro.flush();

    // break the string if it is too long
    return ostr.str();
}